

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrgls_api.hpp
# Opt level: O0

void __thiscall hrgls::StreamProperties::StreamProperties(StreamProperties *this)

{
  mapped_type mVar1;
  StreamProperties_private *this_00;
  element_type *peVar2;
  mapped_type *pmVar3;
  key_type local_30;
  undefined8 local_28;
  hrgls_StreamProperties ptr;
  StreamProperties *local_10;
  StreamProperties *this_local;
  
  local_10 = this;
  std::shared_ptr<hrgls::StreamProperties::StreamProperties_private>::shared_ptr(&this->m_private);
  this_00 = (StreamProperties_private *)operator_new(0x40);
  StreamProperties_private::StreamProperties_private(this_00);
  std::__shared_ptr<hrgls::StreamProperties::StreamProperties_private,_(__gnu_cxx::_Lock_policy)2>::
  reset<hrgls::StreamProperties::StreamProperties_private>
            ((__shared_ptr<hrgls::StreamProperties::StreamProperties_private,_(__gnu_cxx::_Lock_policy)2>
              *)this,this_00);
  mVar1 = hrgls_StreamPropertiesCreate(&local_28);
  peVar2 = std::
           __shared_ptr_access<hrgls::StreamProperties::StreamProperties_private,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<hrgls::StreamProperties::StreamProperties_private,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
  local_30._M_thread = (native_handle_type)std::this_thread::get_id();
  pmVar3 = std::
           map<std::thread::id,_int,_std::less<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_int>_>_>
           ::operator[](&peVar2->m_status,&local_30);
  *pmVar3 = mVar1;
  peVar2 = std::
           __shared_ptr_access<hrgls::StreamProperties::StreamProperties_private,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<hrgls::StreamProperties::StreamProperties_private,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
  std::__shared_ptr<hrgls_StreamProperties_,(__gnu_cxx::_Lock_policy)2>::
  reset<hrgls_StreamProperties_,hrgls::StreamProperties::StreamProperties()::__0>
            ((__shared_ptr<hrgls_StreamProperties_,(__gnu_cxx::_Lock_policy)2> *)peVar2,local_28);
  return;
}

Assistant:

StreamProperties::StreamProperties()
  {
    // Create our private data object
    m_private.reset(new StreamProperties_private);
    hrgls_StreamProperties ptr;
    m_private->m_status[std::this_thread::get_id()] = hrgls_StreamPropertiesCreate(&ptr);
    m_private->m_state.reset(ptr,
      [](hrgls_StreamProperties_ *obj) {hrgls_StreamPropertiesDestroy(obj); }
      );
  }